

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write.cpp
# Opt level: O2

void testWriteBadArgs(string *tempdir)

{
  int iVar1;
  uint uVar2;
  ostream *poVar3;
  char *pcVar4;
  ostream *poVar5;
  undefined8 extraout_RAX;
  char *func;
  exr_context_t f;
  char local_98 [8];
  code *local_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  string fn;
  
  std::operator+(&fn,tempdir,"invalid.exr");
  local_48 = 0;
  local_58 = 0;
  uStack_50 = 0;
  local_68 = 0;
  uStack_60 = 0;
  local_38 = 0;
  local_78 = 0;
  uStack_70 = 0;
  local_88 = 0;
  uStack_80 = 0;
  local_98[0] = 'h';
  local_98[1] = '\0';
  local_98[2] = '\0';
  local_98[3] = '\0';
  local_98[4] = '\0';
  local_98[5] = '\0';
  local_98[6] = '\0';
  local_98[7] = '\0';
  uStack_40 = 0xbf800000fffffffe;
  local_90 = err_cb;
  func = (char *)0x0;
  iVar1 = exr_start_write(0,fn._M_dataplus._M_p,0);
  if (iVar1 == 3) {
    func = (char *)0x0;
    uVar2 = exr_start_write(&f,0,0);
    poVar5 = (ostream *)(ulong)uVar2;
    if (uVar2 == 3) {
      func = local_98;
      uVar2 = exr_start_write(&f,0,0);
      poVar5 = (ostream *)(ulong)uVar2;
      if (uVar2 == 3) {
        std::__cxx11::string::~string((string *)&fn);
        return;
      }
      goto LAB_0013025a;
    }
  }
  else {
    poVar5 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar1);
    poVar5 = std::operator<<(poVar5,") ");
    pcVar4 = (char *)exr_get_default_error_message(iVar1);
    poVar5 = std::operator<<(poVar5,pcVar4);
    poVar5 = std::operator<<(poVar5,"\n    expected: (");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,3);
    poVar5 = std::operator<<(poVar5,") ");
    pcVar4 = (char *)exr_get_default_error_message(3);
    poVar3 = std::operator<<(poVar5,pcVar4);
    std::endl<char,std::char_traits<char>>(poVar3);
    core_test_fail("exr_start_write (__null, fn.c_str (), EXR_WRITE_FILE_DIRECTLY, __null)",
                   (char *)0x24,0x15836d,func);
  }
  poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,(int)poVar5);
  poVar3 = std::operator<<(poVar3,") ");
  pcVar4 = (char *)exr_get_default_error_message((ulong)poVar5 & 0xffffffff);
  poVar5 = std::operator<<(poVar3,pcVar4);
  poVar5 = std::operator<<(poVar5,"\n    expected: (");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,3);
  poVar5 = std::operator<<(poVar5,") ");
  pcVar4 = (char *)exr_get_default_error_message(3);
  poVar3 = std::operator<<(poVar5,pcVar4);
  std::endl<char,std::char_traits<char>>(poVar3);
  core_test_fail("exr_start_write (&f, __null, EXR_WRITE_FILE_DIRECTLY, __null)",(char *)0x27,
                 0x15836d,func);
LAB_0013025a:
  poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,(int)poVar5);
  poVar3 = std::operator<<(poVar3,") ");
  pcVar4 = (char *)exr_get_default_error_message((ulong)poVar5 & 0xffffffff);
  poVar5 = std::operator<<(poVar3,pcVar4);
  poVar5 = std::operator<<(poVar5,"\n    expected: (");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,3);
  poVar5 = std::operator<<(poVar5,") ");
  pcVar4 = (char *)exr_get_default_error_message(3);
  poVar5 = std::operator<<(poVar5,pcVar4);
  std::endl<char,std::char_traits<char>>(poVar5);
  core_test_fail("exr_start_write (&f, __null, EXR_WRITE_FILE_DIRECTLY, &cinit)",(char *)0x2a,
                 0x15836d,func);
  std::__cxx11::string::~string((string *)&fn);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

void
testWriteBadArgs (const std::string& tempdir)
{
    exr_context_t             f;
    std::string               fn    = tempdir + "invalid.exr";
    exr_context_initializer_t cinit = EXR_DEFAULT_CONTEXT_INITIALIZER;
    cinit.error_handler_fn          = &err_cb;

    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_INVALID_ARGUMENT,
        exr_start_write (NULL, fn.c_str (), EXR_WRITE_FILE_DIRECTLY, NULL));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_INVALID_ARGUMENT,
        exr_start_write (&f, NULL, EXR_WRITE_FILE_DIRECTLY, NULL));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_INVALID_ARGUMENT,
        exr_start_write (&f, NULL, EXR_WRITE_FILE_DIRECTLY, &cinit));

    //    EXRCORE_TEST_RVAL_FAIL (EXR_ERR_FILE_ACCESS, exr_start_write (&f, fn.c_str (), &cinit));
}